

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

void __thiscall AixLog::SinkFormat::SinkFormat(SinkFormat *this,Filter *filter,string *format)

{
  Sink::Sink(&this->super_Sink,filter);
  (this->super_Sink)._vptr_Sink = (_func_int **)&PTR__SinkFormat_001d9d50;
  std::__cxx11::string::string((string *)&this->format_,(string *)format);
  return;
}

Assistant:

SinkFormat(const Filter& filter, const std::string& format)
      : Sink(filter), format_(format) {}